

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ConnectRequest *pCVar3;
  Tcp *pTVar4;
  int iVar5;
  ostream *poVar6;
  long *extraout_RDX;
  shared_ptr<uv11::ConnectRequest> connectRequest;
  shared_ptr<uv11::Tcp> tcp;
  shared_ptr<uv11::GetAddrInfoRequest> addrRequest;
  sockaddr_in addr;
  code **local_98;
  long lStack_90;
  code *local_88;
  code *pcStack_80;
  Tcp *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  ConnectRequest *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  ConnectRequest *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  Tcp *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  GetAddrInfoRequest *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  sockaddr_in local_20;
  
  local_30 = (GetAddrInfoRequest *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<uv11::GetAddrInfoRequest,std::allocator<uv11::GetAddrInfoRequest>>
            (&local_28,&local_30,(allocator<uv11::GetAddrInfoRequest> *)&local_98);
  local_98 = (code **)0x0;
  lStack_90 = 0;
  pcStack_80 = std::
               _Function_handler<void_(uv11::GetAddrInfoRequest_&,_std::error_code,_uv11::UvAddrInfoPtr),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/erikjohnston[P]uv11/src/main.cpp:18:9)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(uv11::GetAddrInfoRequest_&,_std::error_code,_uv11::UvAddrInfoPtr),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/erikjohnston[P]uv11/src/main.cpp:18:9)>
             ::_M_manager;
  uv11::getaddrinfo((Loop *)&uv11::default_loop,local_30,(function *)&local_98,"www.google.com",
                    (char *)0x0);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  local_40 = (Tcp *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<uv11::Tcp,std::allocator<uv11::Tcp>>
            (&local_38,&local_40,(allocator<uv11::Tcp> *)&local_98);
  local_50 = (ConnectRequest *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<uv11::ConnectRequest,std::allocator<uv11::ConnectRequest>>
            (&local_48,&local_50,(allocator<uv11::ConnectRequest> *)&local_98);
  uv11::ip4_addr("216.58.208.46",0x50,&local_20);
  pTVar4 = local_40;
  pCVar3 = local_50;
  local_78 = local_40;
  p_Stack_70 = local_38._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  local_68 = local_50;
  p_Stack_60 = local_48._M_pi;
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
    }
  }
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98 = (code **)0x0;
  lStack_90 = 0;
  local_98 = (code **)operator_new(0x20);
  p_Var2 = p_Stack_60;
  p_Var1 = p_Stack_70;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *local_98 = (code *)local_78;
  local_98[1] = (code *)p_Var1;
  local_78 = (Tcp *)0x0;
  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98[2] = (code *)local_68;
  local_98[3] = (code *)p_Var2;
  local_68 = (ConnectRequest *)0x0;
  pcStack_80 = std::
               _Function_handler<void_(uv11::ConnectRequest_&,_std::error_code),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/erikjohnston[P]uv11/src/main.cpp:70:9)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(uv11::ConnectRequest_&,_std::error_code),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/erikjohnston[P]uv11/src/main.cpp:70:9)>
             ::_M_manager;
  iVar5 = uv11::tcp_connect(pCVar3,pTVar4,(sockaddr *)&local_20,(function *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  local_98 = (code **)0x0;
  lStack_90 = 0;
  pcStack_80 = std::
               _Function_handler<void_(uv11::Handle_&,_unsigned_long,_uv_buf_t_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/erikjohnston[P]uv11/src/main.cpp:99:9)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(uv11::Handle_&,_unsigned_long,_uv_buf_t_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/erikjohnston[P]uv11/src/main.cpp:99:9)>
             ::_M_manager;
  local_78 = (Tcp *)0x0;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::
               _Function_handler<void_(uv11::Stream_&,_const_uv11::Buffer_&,_long,_std::error_code),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/erikjohnston[P]uv11/src/main.cpp:103:9)>
               ::_M_invoke;
  local_68 = (ConnectRequest *)
             std::
             _Function_handler<void_(uv11::Stream_&,_const_uv11::Buffer_&,_long,_std::error_code),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/erikjohnston[P]uv11/src/main.cpp:103:9)>
             ::_M_manager;
  uv11::read_start((Stream *)local_40,(function *)&local_98,(function *)&local_78);
  if (local_68 != (ConnectRequest *)0x0) {
    (*(code *)local_68)(&local_78,&local_78,3);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  if (iVar5 != 0) {
    (**(code **)(*extraout_RDX + 0x20))(&local_98,extraout_RDX,iVar5);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_98,lStack_90);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
  }
  iVar5 = uv11::run((Loop *)&uv11::default_loop,UV_RUN_DEFAULT);
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  return iVar5;
}

Assistant:

int main() {

    auto addrRequest = std::make_shared<uv11::GetAddrInfoRequest>();
    uv11::getaddrinfo(
        uv11::default_loop,
        *addrRequest,
        [] (uv11::GetAddrInfoRequest&, uv11::Error e, uv11::UvAddrInfoPtr res) {
            if (e) {
                std::cout << "Addr info error: " << e.message() << std::endl;
            } else {
                std::string ip;
                addrinfo& a = *res;
                while (true) {
                    void * in_addr;
                    if (a.ai_family == AF_INET) {
                        in_addr = &reinterpret_cast<sockaddr_in*>(a.ai_addr)->sin_addr;
                    } else if (a.ai_family == AF_INET6) {
                        in_addr = &reinterpret_cast<sockaddr_in6*>(a.ai_addr)->sin6_addr;
                    } else {
                        std::cout << "unrecognized family " << a.ai_family << std::endl;
                        break;
                    }

                    auto err = uv11::inet_ntop(
                        a.ai_family,
                        &reinterpret_cast<sockaddr_in*>(a.ai_addr)->sin_addr,
                        ip
                    );

                    if (err) {
                        std::cout << "Failed to parse " << err.message() << std::endl;
                        break;
                    }

                    auto p = ::getprotobynumber(a.ai_protocol);
                    std::cout << ((a.ai_family == AF_INET) ? "IPv4" : "IPv6") << " " << ip << " " << p->p_name<< std::endl;

                    if (a.ai_next) {
                        a = *a.ai_next;
                        continue;
                    } else {
                        break;
                    }
                }
            }
        },
        "www.google.com", nullptr
    );

    sockaddr_in addr;

    auto tcp = std::make_shared<uv11::Tcp>();
    auto connectRequest = std::make_shared<uv11::ConnectRequest>();

    uv11::ip4_addr("216.58.208.46", 80, addr);

    auto e = uv11::tcp_connect(
        *connectRequest, *tcp, reinterpret_cast<sockaddr&>(addr),
        [tcp, connectRequest] (uv11::ConnectRequest&, uv11::Error e) {
            std::cout << "Connected!" << std::endl;
            if (e) {
                std::cout << e.message() << std::endl;
            }

            auto write_req = std::make_shared<uv11::WriteRequest>();

            char temp[] =  "GET / HTTP/1.1\r\nContent-Length: 0\r\nConnection: Close\r\n\r\n";
            auto get_request = std::make_shared<std::vector<char>>(
                std::begin(temp), std::end(temp)
            );

            uv11::write(
                *write_req,
                *tcp,
                uv11::make_buffer(*get_request),
                [tcp, write_req, get_request] (uv11::WriteRequest&, uv11::Error e) {
                    std::cout << "written" << std::endl;
                    if (e) {
                        std::cout << "Write error: " << e.message() << std::endl;
                    }
                }
            );
        }
    );

    uv11::read_start(
        *tcp,
        [] (uv11::Handle&, std::size_t suggested_size, uv11::uv_buf_t* buf) {
            buf->base = new char[suggested_size];
            buf->len = suggested_size;
        },
        [](uv11::Stream&, uv11::Buffer const& buf, ::ssize_t nread, uv11::Error e) {
            if (e) {
                std::cout << "Read error: " << e.message() << std::endl;
            } else {
                std::cout.write(buf.base, nread);
                std::cout << std::endl;
            }

            delete[] buf.base;
        });

    if (e) {
        std::cout << e.message() << std::endl;
    }

    return uv11::run(uv11::default_loop, uv11::RunMode::UV_RUN_DEFAULT);
}